

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

CBlockUndo *
GetUndoChecked(CBlockUndo *__return_storage_ptr__,BlockManager *blockman,CBlockIndex *blockindex)

{
  bool bVar1;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  allocator<char> local_59;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (blockindex->nHeight != 0) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock33,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
               ,0x28a,false);
    bVar1 = node::BlockManager::IsBlockPruned(blockman,blockindex);
    if (bVar1) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Undo data not available (pruned data)",&local_59);
      JSONRPCError(pUVar2,-1,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0028982e;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock33.super_unique_lock);
    bVar1 = node::BlockManager::UndoReadFromDisk(blockman,__return_storage_ptr__,blockindex);
    if (!bVar1) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Can\'t read undo data from disk",
                 (allocator<char> *)&criticalblock33);
      JSONRPCError(pUVar2,-1,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0028982e;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_0028982e:
  __stack_chk_fail();
}

Assistant:

static CBlockUndo GetUndoChecked(BlockManager& blockman, const CBlockIndex& blockindex)
{
    CBlockUndo blockUndo;

    // The Genesis block does not have undo data
    if (blockindex.nHeight == 0) return blockUndo;

    {
        LOCK(cs_main);
        if (blockman.IsBlockPruned(blockindex)) {
            throw JSONRPCError(RPC_MISC_ERROR, "Undo data not available (pruned data)");
        }
    }

    if (!blockman.UndoReadFromDisk(blockUndo, blockindex)) {
        throw JSONRPCError(RPC_MISC_ERROR, "Can't read undo data from disk");
    }

    return blockUndo;
}